

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusionBase::addMulWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *target,ImageFloat *image,ImageFloat *weight)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  Image<float,_gimage::PixelTraits<float>_> *in_RCX;
  Image<float,_gimage::PixelTraits<float>_> *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  float *w;
  float *im;
  float *pn;
  float *p;
  int d;
  float *local_48;
  float *local_40;
  float *local_30;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI);
    if (iVar1 <= local_24) break;
    pfVar2 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RSI,0,0,local_24);
    lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
    lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    local_40 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RDX,0,0,local_24);
    local_48 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RCX,0,0,0);
    local_30 = pfVar2;
    while (local_30 < pfVar2 + lVar3 * lVar4) {
      *local_30 = *local_40 * *local_48 + *local_30;
      local_48 = local_48 + 1;
      local_40 = local_40 + 1;
      local_30 = local_30 + 1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::addMulWeight(ImageFloat &target, ImageFloat &image, ImageFloat &weight)
{
  for (int d=0; d<target.getDepth(); d++)
  {
    float *p=target.getPtr(0, 0, d);
    float *pn=p+target.getWidth()*target.getHeight();
    float *im=image.getPtr(0, 0, d);
    float *w=weight.getPtr(0, 0, 0);

    while (p < pn)
    {
      *p++ += *im++ * *w++;
    }
  }
}